

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O0

MPP_RET mpi_enc_gen_osd_data
                  (MppEncOSDData *osd_data,MppBufferGroup group,RK_U32 width,RK_U32 height,
                  RK_U32 frame_cnt)

{
  long lVar1;
  bool local_79;
  void *ptr;
  MppBuffer pvStack_68;
  RK_U32 region_size;
  MppBuffer buf;
  RK_U32 mb_h;
  RK_U32 mb_w;
  RK_U32 mb_y;
  RK_U32 mb_x;
  RK_U32 step_y;
  RK_U32 step_x;
  RK_U32 mb_h_max;
  RK_U32 mb_w_max;
  RK_U32 buf_size;
  RK_U32 buf_offset;
  RK_U32 num_region;
  RK_U32 k;
  MppEncOSDRegion *region;
  RK_U32 local_20;
  RK_U32 frame_cnt_local;
  RK_U32 height_local;
  RK_U32 width_local;
  MppBufferGroup group_local;
  MppEncOSDData *osd_data_local;
  
  _num_region = (uint *)0x0;
  buf_offset = 0;
  buf_size = 8;
  mb_w_max = 0;
  mb_h_max = 0;
  step_x = width + 0xf >> 4;
  step_y = height + 0xf >> 4;
  buf._4_4_ = step_x + 7 >> 3;
  buf._0_4_ = step_y + 0xf >> 4;
  mb_w = (frame_cnt * buf._4_4_) % step_x;
  mb_h = (frame_cnt * (uint)buf) % step_y;
  pvStack_68 = osd_data->buf;
  mb_y = (uint)buf;
  mb_x = buf._4_4_;
  region._4_4_ = frame_cnt;
  local_20 = height;
  frame_cnt_local = width;
  _height_local = group;
  group_local = osd_data;
  if (pvStack_68 != (MppBuffer)0x0) {
    mb_h_max = mpp_buffer_get_size_with_caller(pvStack_68,"mpi_enc_gen_osd_data");
  }
  *(RK_U32 *)((long)group_local + 8) = buf_size;
  _num_region = (uint *)((long)group_local + 0xc);
  for (buf_offset = 0; buf_offset < buf_size; buf_offset = buf_offset + 1) {
    _num_region[1] = 1;
    _num_region[2] = mb_w;
    _num_region[3] = mb_h;
    _num_region[4] = buf._4_4_;
    _num_region[5] = (uint)buf;
    _num_region[6] = mb_w_max;
    local_79 = buf._4_4_ != 0 && (uint)buf != 0;
    *_num_region = (uint)local_79;
    mb_w_max = buf._4_4_ * (uint)buf * 0x100 + mb_w_max;
    mb_w = mb_x + mb_w;
    mb_h = mb_y + mb_h;
    if (step_x <= mb_w) {
      mb_w = mb_w - step_x;
    }
    if (step_y <= mb_h) {
      mb_h = mb_h - step_y;
    }
    _num_region = _num_region + 7;
  }
  if (mb_h_max < mb_w_max) {
    if (pvStack_68 != (MppBuffer)0x0) {
      mpp_buffer_put_with_caller(pvStack_68,"mpi_enc_gen_osd_data");
    }
    mpp_buffer_get_with_tag
              (_height_local,&stack0xffffffffffffff98,mb_w_max,"mpi_enc_utils",
               "mpi_enc_gen_osd_data");
    if (pvStack_68 == (MppBuffer)0x0) {
      _mpp_log_l(2,"mpi_enc_utils","failed to create osd buffer size %d\n","mpi_enc_gen_osd_data",
                 mb_w_max);
    }
  }
  if (pvStack_68 != (MppBuffer)0x0) {
    lVar1 = mpp_buffer_get_ptr_with_caller(pvStack_68,"mpi_enc_gen_osd_data");
    _num_region = (uint *)((long)group_local + 0xc);
    for (buf_offset = 0; buf_offset < buf_size; buf_offset = buf_offset + 1) {
      buf._4_4_ = *(int *)((long)_num_region + 0x10);
      buf._0_4_ = *(int *)((long)_num_region + 0x14);
      mb_w_max = *(uint *)((long)_num_region + 0x18);
      memset((void *)(lVar1 + (ulong)mb_w_max),buf_offset & 0xff,
             (ulong)(buf._4_4_ * (uint)buf * 0x100));
      _num_region = (uint *)((long)_num_region + 0x1c);
    }
  }
  *(MppBuffer *)group_local = pvStack_68;
  return MPP_OK;
}

Assistant:

MPP_RET mpi_enc_gen_osd_data(MppEncOSDData *osd_data, MppBufferGroup group,
                             RK_U32 width, RK_U32 height, RK_U32 frame_cnt)
{
    MppEncOSDRegion *region = NULL;
    RK_U32 k = 0;
    RK_U32 num_region = 8;
    RK_U32 buf_offset = 0;
    RK_U32 buf_size = 0;
    RK_U32 mb_w_max = MPP_ALIGN(width, 16) / 16;
    RK_U32 mb_h_max = MPP_ALIGN(height, 16) / 16;
    RK_U32 step_x = MPP_ALIGN(mb_w_max, 8) / 8;
    RK_U32 step_y = MPP_ALIGN(mb_h_max, 16) / 16;
    RK_U32 mb_x = (frame_cnt * step_x) % mb_w_max;
    RK_U32 mb_y = (frame_cnt * step_y) % mb_h_max;
    RK_U32 mb_w = step_x;
    RK_U32 mb_h = step_y;
    MppBuffer buf = osd_data->buf;

    if (buf)
        buf_size = mpp_buffer_get_size(buf);

    /* generate osd region info */
    osd_data->num_region = num_region;

    region = osd_data->region;

    for (k = 0; k < num_region; k++, region++) {
        // NOTE: offset must be 16 byte aligned
        RK_U32 region_size = MPP_ALIGN(mb_w * mb_h * 256, 16);

        region->inverse = 1;
        region->start_mb_x = mb_x;
        region->start_mb_y = mb_y;
        region->num_mb_x = mb_w;
        region->num_mb_y = mb_h;
        region->buf_offset = buf_offset;
        region->enable = (mb_w && mb_h);

        buf_offset += region_size;

        mb_x += step_x;
        mb_y += step_y;
        if (mb_x >= mb_w_max)
            mb_x -= mb_w_max;
        if (mb_y >= mb_h_max)
            mb_y -= mb_h_max;
    }

    /* create buffer and write osd index data */
    if (buf_size < buf_offset) {
        if (buf)
            mpp_buffer_put(buf);

        mpp_buffer_get(group, &buf, buf_offset);
        if (NULL == buf)
            mpp_err_f("failed to create osd buffer size %d\n", buf_offset);
    }

    if (buf) {
        void *ptr = mpp_buffer_get_ptr(buf);
        region = osd_data->region;

        for (k = 0; k < num_region; k++, region++) {
            mb_w = region->num_mb_x;
            mb_h = region->num_mb_y;
            buf_offset = region->buf_offset;

            memset(ptr + buf_offset, k, mb_w * mb_h * 256);
        }
    }

    osd_data->buf = buf;

    return MPP_OK;
}